

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_PCM.cpp
# Opt level: O3

h__Writer * __thiscall
AS_02::PCM::MXFWriter::h__Writer::OpenWrite
          (h__Writer *this,string *filename,FileDescriptor *essence_descriptor,
          InterchangeObject_list_t *essence_sub_descriptor_list,ui32_t *header_size)

{
  ui32_t *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  pointer pcVar4;
  undefined8 *puVar5;
  ILogSink *pIVar6;
  _List_node_base *p_Var7;
  undefined1 *puVar8;
  undefined4 *in_R9;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long *local_138;
  undefined7 local_12f;
  long lStack_128;
  char cStack_120;
  allocator<char> local_d0 [9];
  undefined8 local_c7;
  undefined8 uStack_bf;
  undefined8 local_a7;
  undefined8 uStack_9f;
  undefined1 local_90 [9];
  char local_87;
  char cStack_86;
  char cStack_85;
  char cStack_84;
  char cStack_83;
  char cStack_82;
  char cStack_81;
  char cStack_80;
  char cStack_7f;
  char cStack_7e;
  char cStack_7d;
  char cStack_7c;
  char cStack_7b;
  char cStack_7a;
  char cStack_79;
  char cStack_78;
  undefined8 local_67;
  undefined8 uStack_5f;
  undefined1 local_50 [9];
  undefined1 local_47 [16];
  
  if (essence_sub_descriptor_list == (InterchangeObject_list_t *)0x0) {
    __assert_fail("essence_descriptor",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_PCM.cpp"
                  ,0x167,
                  "ASDCP::Result_t AS_02::PCM::MXFWriter::h__Writer::OpenWrite(const std::string &, ASDCP::MXF::FileDescriptor *, ASDCP::MXF::InterchangeObject_list_t &, const ui32_t &)"
                 );
  }
  pcVar4 = (pointer)__dynamic_cast(essence_sub_descriptor_list,&ASDCP::MXF::FileDescriptor::typeinfo
                                   ,&ASDCP::MXF::WaveAudioDescriptor::typeinfo,0);
  filename[0x2e]._M_dataplus._M_p = pcVar4;
  if (pcVar4 == (pointer)0x0) {
    pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar6,"Essence descriptor is not a WaveAudioDescriptor.\n");
    (*(code *)(essence_sub_descriptor_list->
              super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
              )._M_impl._M_node.super__List_node_base._M_next[8]._M_prev)
              (essence_sub_descriptor_list,0);
    puVar8 = RESULT_AS02_FORMAT;
  }
  else {
    if (*(int *)&filename[0x1b].field_2 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,*(char **)essence_descriptor,local_d0);
      Kumu::FileWriter::OpenWrite((string *)this);
      if (local_138 != &lStack_128) {
        operator_delete(local_138,lStack_128 + 1);
      }
      if (*(int *)&(this->super_h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR>).
                   super_h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR>.
                   super_TrackFileWriter<ASDCP::MXF::OP1aHeader>._vptr_TrackFileWriter < 0) {
        return this;
      }
      *(undefined4 *)&filename[2]._M_string_length = *in_R9;
      *(InterchangeObject_list_t **)((long)&filename[0x18].field_2 + 8) =
           essence_sub_descriptor_list;
      pcVar4 = filename[0x2e]._M_dataplus._M_p;
      *(undefined8 *)(pcVar4 + 0xf0) = *(undefined8 *)(pcVar4 + 0x158);
      for (puVar1 = *(ui32_t **)header_size; puVar1 != header_size; puVar1 = *(ui32_t **)puVar1) {
        (**(code **)(**(long **)(puVar1 + 4) + 0x10))(&local_138);
        puVar5 = (undefined8 *)ASDCP::Dictionary::Type((MDD_t)filename->_M_string_length);
        uVar2 = *puVar5;
        uVar3 = puVar5[1];
        local_c7._0_1_ = (char)uVar2;
        local_c7._1_1_ = (char)((ulong)uVar2 >> 8);
        local_c7._2_1_ = (char)((ulong)uVar2 >> 0x10);
        local_c7._3_1_ = (char)((ulong)uVar2 >> 0x18);
        local_c7._4_1_ = (char)((ulong)uVar2 >> 0x20);
        local_c7._5_1_ = (char)((ulong)uVar2 >> 0x28);
        local_c7._6_1_ = (char)((ulong)uVar2 >> 0x30);
        local_c7._7_1_ = (char)((ulong)uVar2 >> 0x38);
        uStack_bf._0_1_ = (char)uVar3;
        uStack_bf._1_1_ = (char)((ulong)uVar3 >> 8);
        uStack_bf._2_1_ = (char)((ulong)uVar3 >> 0x10);
        uStack_bf._3_1_ = (char)((ulong)uVar3 >> 0x18);
        uStack_bf._4_1_ = (char)((ulong)uVar3 >> 0x20);
        uStack_bf._5_1_ = (char)((ulong)uVar3 >> 0x28);
        uStack_bf._6_1_ = (char)((ulong)uVar3 >> 0x30);
        uStack_bf._7_1_ = (char)((ulong)uVar3 >> 0x38);
        auVar9[0] = -((char)local_c7 == (char)local_12f);
        auVar9[1] = -(local_c7._1_1_ == (char)((uint7)local_12f >> 8));
        auVar9[2] = -(local_c7._2_1_ == (char)((uint7)local_12f >> 0x10));
        auVar9[3] = -(local_c7._3_1_ == (char)((uint7)local_12f >> 0x18));
        auVar9[4] = -(local_c7._4_1_ == (char)((uint7)local_12f >> 0x20));
        auVar9[5] = -(local_c7._5_1_ == (char)((uint7)local_12f >> 0x28));
        auVar9[6] = -(local_c7._6_1_ == (char)((uint7)local_12f >> 0x30));
        auVar9[7] = -(local_c7._7_1_ == (char)lStack_128);
        auVar9[8] = -((char)uStack_bf == (char)((ulong)lStack_128 >> 8));
        auVar9[9] = -(uStack_bf._1_1_ == (char)((ulong)lStack_128 >> 0x10));
        auVar9[10] = -(uStack_bf._2_1_ == (char)((ulong)lStack_128 >> 0x18));
        auVar9[0xb] = -(uStack_bf._3_1_ == (char)((ulong)lStack_128 >> 0x20));
        auVar9[0xc] = -(uStack_bf._4_1_ == (char)((ulong)lStack_128 >> 0x28));
        auVar9[0xd] = -(uStack_bf._5_1_ == (char)((ulong)lStack_128 >> 0x30));
        auVar9[0xe] = -(uStack_bf._6_1_ == (char)((ulong)lStack_128 >> 0x38));
        auVar9[0xf] = -(uStack_bf._7_1_ == cStack_120);
        local_c7 = uVar2;
        uStack_bf = uVar3;
        if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar9[0xf] >> 7) << 0xf) != 0xffff) {
          (**(code **)(**(long **)(puVar1 + 4) + 0x10))(local_50);
          puVar5 = (undefined8 *)ASDCP::Dictionary::Type((MDD_t)filename->_M_string_length);
          uVar2 = *puVar5;
          uVar3 = puVar5[1];
          local_67._0_1_ = (char)uVar2;
          local_67._1_1_ = (char)((ulong)uVar2 >> 8);
          local_67._2_1_ = (char)((ulong)uVar2 >> 0x10);
          local_67._3_1_ = (char)((ulong)uVar2 >> 0x18);
          local_67._4_1_ = (char)((ulong)uVar2 >> 0x20);
          local_67._5_1_ = (char)((ulong)uVar2 >> 0x28);
          local_67._6_1_ = (char)((ulong)uVar2 >> 0x30);
          local_67._7_1_ = (char)((ulong)uVar2 >> 0x38);
          uStack_5f._0_1_ = (char)uVar3;
          uStack_5f._1_1_ = (char)((ulong)uVar3 >> 8);
          uStack_5f._2_1_ = (char)((ulong)uVar3 >> 0x10);
          uStack_5f._3_1_ = (char)((ulong)uVar3 >> 0x18);
          uStack_5f._4_1_ = (char)((ulong)uVar3 >> 0x20);
          uStack_5f._5_1_ = (char)((ulong)uVar3 >> 0x28);
          uStack_5f._6_1_ = (char)((ulong)uVar3 >> 0x30);
          uStack_5f._7_1_ = (char)((ulong)uVar3 >> 0x38);
          auVar10[0] = -((char)local_67 == local_47[0]);
          auVar10[1] = -(local_67._1_1_ == local_47[1]);
          auVar10[2] = -(local_67._2_1_ == local_47[2]);
          auVar10[3] = -(local_67._3_1_ == local_47[3]);
          auVar10[4] = -(local_67._4_1_ == local_47[4]);
          auVar10[5] = -(local_67._5_1_ == local_47[5]);
          auVar10[6] = -(local_67._6_1_ == local_47[6]);
          auVar10[7] = -(local_67._7_1_ == local_47[7]);
          auVar10[8] = -((char)uStack_5f == local_47[8]);
          auVar10[9] = -(uStack_5f._1_1_ == local_47[9]);
          auVar10[10] = -(uStack_5f._2_1_ == local_47[10]);
          auVar10[0xb] = -(uStack_5f._3_1_ == local_47[0xb]);
          auVar10[0xc] = -(uStack_5f._4_1_ == local_47[0xc]);
          auVar10[0xd] = -(uStack_5f._5_1_ == local_47[0xd]);
          auVar10[0xe] = -(uStack_5f._6_1_ == local_47[0xe]);
          auVar10[0xf] = -(uStack_5f._7_1_ == local_47[0xf]);
          local_67 = uVar2;
          uStack_5f = uVar3;
          if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar10[0xf] >> 7) << 0xf) != 0xffff) {
            (**(code **)(**(long **)(puVar1 + 4) + 0x10))(local_90);
            puVar5 = (undefined8 *)ASDCP::Dictionary::Type((MDD_t)filename->_M_string_length);
            uVar2 = *puVar5;
            uVar3 = puVar5[1];
            local_a7._0_1_ = (char)uVar2;
            local_a7._1_1_ = (char)((ulong)uVar2 >> 8);
            local_a7._2_1_ = (char)((ulong)uVar2 >> 0x10);
            local_a7._3_1_ = (char)((ulong)uVar2 >> 0x18);
            local_a7._4_1_ = (char)((ulong)uVar2 >> 0x20);
            local_a7._5_1_ = (char)((ulong)uVar2 >> 0x28);
            local_a7._6_1_ = (char)((ulong)uVar2 >> 0x30);
            local_a7._7_1_ = (char)((ulong)uVar2 >> 0x38);
            uStack_9f._0_1_ = (char)uVar3;
            uStack_9f._1_1_ = (char)((ulong)uVar3 >> 8);
            uStack_9f._2_1_ = (char)((ulong)uVar3 >> 0x10);
            uStack_9f._3_1_ = (char)((ulong)uVar3 >> 0x18);
            uStack_9f._4_1_ = (char)((ulong)uVar3 >> 0x20);
            uStack_9f._5_1_ = (char)((ulong)uVar3 >> 0x28);
            uStack_9f._6_1_ = (char)((ulong)uVar3 >> 0x30);
            uStack_9f._7_1_ = (char)((ulong)uVar3 >> 0x38);
            auVar11[0] = -((char)local_a7 == local_87);
            auVar11[1] = -(local_a7._1_1_ == cStack_86);
            auVar11[2] = -(local_a7._2_1_ == cStack_85);
            auVar11[3] = -(local_a7._3_1_ == cStack_84);
            auVar11[4] = -(local_a7._4_1_ == cStack_83);
            auVar11[5] = -(local_a7._5_1_ == cStack_82);
            auVar11[6] = -(local_a7._6_1_ == cStack_81);
            auVar11[7] = -(local_a7._7_1_ == cStack_80);
            auVar11[8] = -((char)uStack_9f == cStack_7f);
            auVar11[9] = -(uStack_9f._1_1_ == cStack_7e);
            auVar11[10] = -(uStack_9f._2_1_ == cStack_7d);
            auVar11[0xb] = -(uStack_9f._3_1_ == cStack_7c);
            auVar11[0xc] = -(uStack_9f._4_1_ == cStack_7b);
            auVar11[0xd] = -(uStack_9f._5_1_ == cStack_7a);
            auVar11[0xe] = -(uStack_9f._6_1_ == cStack_79);
            auVar11[0xf] = -(uStack_9f._7_1_ == cStack_78);
            local_a7 = uVar2;
            uStack_9f = uVar3;
            if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar11[0xf] >> 7) << 0xf) != 0xffff) {
              pIVar6 = (ILogSink *)Kumu::DefaultLogSink();
              Kumu::ILogSink::Error
                        (pIVar6,"Essence sub-descriptor is not an MCALabelSubDescriptor.\n");
              (**(code **)(**(long **)(puVar1 + 4) + 0x88))(*(long **)(puVar1 + 4),0);
            }
          }
        }
        p_Var7 = (_List_node_base *)operator_new(0x18);
        p_Var7[1]._M_next = *(_List_node_base **)(puVar1 + 4);
        std::__detail::_List_node_base::_M_hook(p_Var7);
        filename[0x19].field_2._M_allocated_capacity =
             filename[0x19].field_2._M_allocated_capacity + 1;
        Kumu::GenRandomValue((UUID *)(*(long *)(puVar1 + 4) + 0x58));
        std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::push_back
                  ((vector<Kumu::UUID,_std::allocator<Kumu::UUID>_> *)
                   (*(long *)((long)&filename[0x18].field_2 + 8) + 200),
                   (value_type *)(*(long *)(puVar1 + 4) + 0x58));
        puVar1[4] = 0;
        puVar1[5] = 0;
      }
      if (*(int *)&filename[0x1b].field_2 == 0) {
        *(undefined4 *)&filename[0x1b].field_2 = 1;
        puVar8 = Kumu::RESULT_OK;
      }
      else {
        puVar8 = Kumu::RESULT_STATE;
      }
      Kumu::Result_t::Result_t((Result_t *)&local_138,(Result_t *)puVar8);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_138);
      Kumu::Result_t::~Result_t((Result_t *)&local_138);
      return this;
    }
    puVar8 = Kumu::RESULT_STATE;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)puVar8);
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::PCM::MXFWriter::h__Writer::OpenWrite(const std::string& filename, ASDCP::MXF::FileDescriptor* essence_descriptor,
					    ASDCP::MXF::InterchangeObject_list_t& essence_sub_descriptor_list, const ui32_t& header_size)
{
  assert(essence_descriptor);

  m_WaveAudioDescriptor = dynamic_cast<ASDCP::MXF::WaveAudioDescriptor*>(essence_descriptor);

  if ( m_WaveAudioDescriptor == 0 )
    {
      DefaultLogSink().Error("Essence descriptor is not a WaveAudioDescriptor.\n");
      essence_descriptor->Dump();
      return RESULT_AS02_FORMAT;
    }

  if ( ! m_State.Test_BEGIN() )
    {
      return RESULT_STATE;
    }

  Result_t result = m_File.OpenWrite(filename.c_str());

  if ( KM_SUCCESS(result) )
    {
      m_HeaderSize = header_size;
      m_EssenceDescriptor = essence_descriptor;
      m_WaveAudioDescriptor->SampleRate = m_WaveAudioDescriptor->AudioSamplingRate;

      ASDCP::MXF::InterchangeObject_list_t::iterator i;
      for ( i = essence_sub_descriptor_list.begin(); i != essence_sub_descriptor_list.end(); ++i )
	{
	  if ( (*i)->GetUL() != UL(m_Dict->ul(MDD_AudioChannelLabelSubDescriptor))
	       && (*i)->GetUL() != UL(m_Dict->ul(MDD_SoundfieldGroupLabelSubDescriptor))
	       && (*i)->GetUL() != UL(m_Dict->ul(MDD_GroupOfSoundfieldGroupsLabelSubDescriptor)) )
	    {
	      DefaultLogSink().Error("Essence sub-descriptor is not an MCALabelSubDescriptor.\n");
	      (*i)->Dump();
	    }

	  m_EssenceSubDescriptorList.push_back(*i);
	  GenRandomValue((*i)->InstanceUID);
	  m_EssenceDescriptor->SubDescriptors.push_back((*i)->InstanceUID);
	  *i = 0; // parent will only free the ones we don't keep
	}

      result = m_State.Goto_INIT();
    }

  return result;
}